

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

int Rml::FormatString(String *string,char *format,__va_list_tag *argument_list)

{
  code *pcVar1;
  bool bVar2;
  undefined8 uStack_168;
  va_list argument_list_copy;
  int i;
  int length;
  size_t max_size;
  char *buffer_ptr;
  char buffer [256];
  size_t InternalBufferSize;
  __va_list_tag *argument_list_local;
  char *format_local;
  String *string_local;
  
  max_size = (size_t)&buffer_ptr;
  _i = 0x100;
  argument_list_copy[0].reg_save_area._4_4_ = 0;
  for (argument_list_copy[0].reg_save_area._0_4_ = 0; (int)argument_list_copy[0].reg_save_area < 2;
      argument_list_copy[0].reg_save_area._0_4_ = (int)argument_list_copy[0].reg_save_area + 1) {
    argument_list_copy[0].overflow_arg_area = argument_list->reg_save_area;
    uStack_168._0_4_ = argument_list->gp_offset;
    uStack_168._4_4_ = argument_list->fp_offset;
    argument_list_copy[0]._0_8_ = argument_list->overflow_arg_area;
    argument_list_copy[0].reg_save_area._4_4_ = vsnprintf((char *)max_size,_i,format,&uStack_168);
    if (argument_list_copy[0].reg_save_area._4_4_ < 0) {
      bVar2 = Assert("Error while formatting string",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/StringUtilities.cpp"
                     ,0x3c);
      if (bVar2) {
        return 0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (((ulong)(long)argument_list_copy[0].reg_save_area._4_4_ < _i) ||
       (0 < (int)argument_list_copy[0].reg_save_area)) break;
    _i = (long)argument_list_copy[0].reg_save_area._4_4_ + 1;
    max_size = (size_t)operator_new__(_i);
  }
  ::std::__cxx11::string::operator=((string *)string,(char *)max_size);
  if (((char **)max_size != &buffer_ptr) && (max_size != 0)) {
    operator_delete__((void *)max_size);
  }
  return argument_list_copy[0].reg_save_area._4_4_;
}

Assistant:

static int FormatString(String& string, const char* format, va_list argument_list)
{
	constexpr size_t InternalBufferSize = 256;
	char buffer[InternalBufferSize];
	char* buffer_ptr = buffer;

	size_t max_size = InternalBufferSize;
	int length = 0;

	for (int i = 0; i < 2; i++)
	{
		va_list argument_list_copy;
		va_copy(argument_list_copy, argument_list);

		length = vsnprintf(buffer_ptr, max_size, format, argument_list_copy);

		va_end(argument_list_copy);

		if (length < 0)
		{
			RMLUI_ERRORMSG("Error while formatting string");
			return 0;
		}

		if ((size_t)length < max_size || i > 0)
			break;

		max_size = (size_t)length + 1;
		buffer_ptr = new char[max_size];
	}

	string = buffer_ptr;

	if (buffer_ptr != buffer)
		delete[] buffer_ptr;

	return length;
}